

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O2

void set_mimic_sym(monst *mtmp,level *lev)

{
  char cVar1;
  char cVar2;
  byte bVar3;
  uint uVar4;
  obj *poVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  uchar uVar10;
  uint uVar11;
  long lVar12;
  
  if (mtmp == (monst *)0x0) {
    return;
  }
  iVar7 = (int)mtmp->mx;
  lVar8 = (long)iVar7;
  cVar1 = mtmp->my;
  lVar12 = (long)cVar1;
  uVar11 = *(ushort *)&lev->locations[lVar8][lVar12].field_0x8 & 0x3f;
  iVar9 = 0;
  if (2 < uVar11) {
    iVar9 = (int)lev->rooms[uVar11 - 3].rtype;
  }
  poVar5 = lev->objects[lVar8][lVar12];
  if (poVar5 == (obj *)0x0) {
    cVar2 = lev->locations[lVar8][lVar12].typ;
    if ((cVar2 == '\x17') || (cVar2 < '\r' && cVar2 != '\0' || (byte)(cVar2 - 0xfU) < 2)) {
      uVar11 = 0x1b;
      if ((mtmp->mx != '\0') &&
         (bVar3 = *(char *)((long)lev + lVar12 * 0xc + lVar8 * 0xfc + -0xb8) - 2, bVar3 < 10)) {
        uVar11 = *(uint *)(&DAT_0029c734 + (ulong)bVar3 * 4);
      }
      if ((((mtmp->field_0x60 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
         ((u.uprops[0xc].extrinsic == 0 &&
          (uVar10 = '\x01', ((youmonst.data)->mflags1 & 0x1000000) == 0)))) goto LAB_001b5f53;
      block_point(iVar7,(int)cVar1);
LAB_001b5f50:
      uVar10 = '\x01';
      goto LAB_001b5f53;
    }
    if ((((lev->flags).field_0xa & 2) == 0) || (uVar4 = mt_random(), (uVar4 & 1) == 0)) {
      if (2 < uVar11) {
        uVar10 = '\x02';
        switch(iVar9) {
        case 4:
        case 8:
          uVar11 = 0x1ef;
          break;
        default:
          if (iVar9 < 0x12) {
            uVar11 = mt_random();
            uVar6 = (ulong)uVar11 % 0x12;
LAB_001b6063:
            iVar7 = (int)"\x12\x13\x04\v\x02\a\f\t\b\x03\x05\x06\x0e\r\n<<<"[uVar6];
          }
          else {
            iVar7 = get_shop_item(iVar9 + -0x12);
            if (iVar7 < 0) {
              uVar11 = -iVar7;
              break;
            }
            if (iVar7 == 0) {
              uVar11 = mt_random();
              uVar6 = (ulong)((uVar11 & 0xf) + 2);
              goto LAB_001b6063;
            }
          }
          uVar11 = 0x1ef;
          if (iVar7 < 0x12) {
            if (iVar7 != 0xc) {
              poVar5 = mkobj(lev,(char)iVar7,'\0');
              uVar11 = (uint)poVar5->otyp;
              obfree(poVar5,(obj *)0x0);
            }
            break;
          }
          uVar11 = iVar7 == 0x12 ^ 0x21;
          goto LAB_001b5f50;
        case 9:
          uVar4 = mt_random();
          uVar10 = (char)(uVar4 & 1) + '\x01';
          uVar11 = 0x215;
          if ((uVar4 & 1) == 0) {
            uVar11 = 0x2b;
          }
          break;
        case 10:
          uVar11 = 0x26;
          goto LAB_001b5f50;
        }
        goto LAB_001b5f53;
      }
      if (((((mtmp->field_0x60 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
          (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
        block_point(iVar7,(int)cVar1);
      }
      uVar11 = 0x214;
    }
    else {
      uVar11 = 0x215;
    }
  }
  else {
    uVar11 = (uint)poVar5->otyp;
  }
  uVar10 = '\x02';
LAB_001b5f53:
  mtmp->m_ap_type = uVar10;
  mtmp->mappearance = uVar11;
  return;
}

Assistant:

void set_mimic_sym(struct monst *mtmp, struct level *lev)
{
	int typ, roomno, rt;
	unsigned appear, ap_type;
	int s_sym;
	struct obj *otmp;
	int mx, my;

	if (!mtmp) return;
	mx = mtmp->mx; my = mtmp->my;
	typ = lev->locations[mx][my].typ;
					/* only valid for INSIDE of room */
	roomno = lev->locations[mx][my].roomno - ROOMOFFSET;
	if (roomno >= 0)
		rt = lev->rooms[roomno].rtype;
	else	rt = 0;	/* roomno < 0 case */

	if (OBJ_AT_LEV(lev, mx, my)) {
		ap_type = M_AP_OBJECT;
		appear = lev->objects[mx][my]->otyp;
	} else if (IS_DOOR(typ) || IS_WALL(typ) ||
		   typ == SDOOR || typ == SCORR) {
		ap_type = M_AP_FURNITURE;
		/*
		 *  If there is a wall to the left that connects to this
		 *  location, then the mimic mimics a horizontal closed door.
		 *  This does not allow doors to be in corners of rooms.
		 */
		if (mx != 0 &&
			(lev->locations[mx-1][my].typ == HWALL    ||
			 lev->locations[mx-1][my].typ == TLCORNER ||
			 lev->locations[mx-1][my].typ == TRWALL   ||
			 lev->locations[mx-1][my].typ == BLCORNER ||
			 lev->locations[mx-1][my].typ == TDWALL   ||
			 lev->locations[mx-1][my].typ == CROSSWALL||
			 lev->locations[mx-1][my].typ == TUWALL    ))
		    appear = S_hcdoor;
		else
		    appear = S_vcdoor;

		if (!mtmp->minvis || See_invisible)
		    block_point(mx,my);	/* vision */
	} else if (lev->flags.is_maze_lev && rn2(2)) {
		ap_type = M_AP_OBJECT;
		appear = STATUE;
	} else if (roomno < 0) {
		ap_type = M_AP_OBJECT;
		appear = BOULDER;
		if (!mtmp->minvis || See_invisible)
		    block_point(mx,my);	/* vision */
	} else if (rt == ZOO || rt == VAULT) {
		ap_type = M_AP_OBJECT;
		appear = GOLD_PIECE;
	} else if (rt == DELPHI) {
		if (rn2(2)) {
			ap_type = M_AP_OBJECT;
			appear = STATUE;
		} else {
			ap_type = M_AP_FURNITURE;
			appear = S_fountain;
		}
	} else if (rt == TEMPLE) {
		ap_type = M_AP_FURNITURE;
		appear = S_altar;
	/*
	 * We won't bother with beehives, morgues, barracks, throne rooms
	 * since they shouldn't contain too many mimics anyway...
	 */
	} else if (rt >= SHOPBASE) {
		s_sym = get_shop_item(rt - SHOPBASE);
		if (s_sym < 0) {
			ap_type = M_AP_OBJECT;
			appear = -s_sym;
		} else {
			if (s_sym == RANDOM_CLASS)
				s_sym = syms[rn2((int)sizeof(syms)-2) + 2];
			goto assign_sym;
		}
	} else {
		s_sym = syms[rn2((int)sizeof(syms))];
assign_sym:
		if (s_sym >= MAXOCLASSES) {
			ap_type = M_AP_FURNITURE;
			appear = s_sym == MAXOCLASSES ? S_upstair : S_dnstair;
		} else if (s_sym == COIN_CLASS) {
			ap_type = M_AP_OBJECT;
			appear = GOLD_PIECE;
		} else {
			ap_type = M_AP_OBJECT;
			if (s_sym == S_MIMIC_DEF) {
				appear = STRANGE_OBJECT;
			} else {
				otmp = mkobj(lev,  (char) s_sym, FALSE );
				appear = otmp->otyp;
				/* make sure container contents are free'ed */
				obfree(otmp, NULL);
			}
		}
	}
	mtmp->m_ap_type = ap_type;
	mtmp->mappearance = appear;
}